

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.c
# Opt level: O2

Expr gc_collect_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                       Expr *args,int argc)

{
  Expr EVar1;
  int objects;
  int pairs;
  int atoms;
  Expr arr [3];
  
  if (argc == 0) {
    gc_collectv(exec,&atoms,&pairs,&objects);
    EVar1 = make_int_from_long(exec,(long)atoms);
    arr[0].field_1 = EVar1.field_1;
    arr[0].type = EVar1.type;
    EVar1 = make_int_from_long(exec,(long)pairs);
    arr[1].field_1 = EVar1.field_1;
    arr[1].type = EVar1.type;
    EVar1 = make_int_from_long(exec,(long)objects);
    arr[2].field_1 = EVar1.field_1;
    arr[2].type = EVar1.type;
    EVar1 = make_list(exec,arr,3);
    return EVar1;
  }
  puts("gc-collect: too many arguments");
  exit(1);
}

Assistant:

BUILTIN_FUNC(gc_collect_builtin)
{
    if (argc != 0)
    {
        log("gc-collect: too many arguments");
        exit(1);
    }
    int atoms, pairs, objects;
    gc_collectv(exec, &atoms, &pairs, &objects);
    Expr arr[3] =
            {
                    make_int_from_long(exec, atoms),
                    make_int_from_long(exec, pairs),
                    make_int_from_long(exec, objects)
            };
    Expr res = make_list(exec, arr, 3);
    return res;
}